

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_iwad.cpp
# Opt level: O0

void __thiscall FIWadManager::ClearChecks(FIWadManager *this)

{
  uint uVar1;
  int *piVar2;
  uint local_14;
  uint i;
  FIWadManager *this_local;
  
  uVar1 = TArray<FIWADInfo,_FIWADInfo>::Size(&this->mIWads);
  TArray<int,_int>::Resize(&this->mLumpsFound,uVar1);
  local_14 = 0;
  while( true ) {
    uVar1 = TArray<int,_int>::Size(&this->mLumpsFound);
    if (uVar1 <= local_14) break;
    piVar2 = TArray<int,_int>::operator[](&this->mLumpsFound,(ulong)local_14);
    *piVar2 = 0;
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void FIWadManager::ClearChecks()
{
	mLumpsFound.Resize(mIWads.Size());
	for(unsigned i=0;i<mLumpsFound.Size(); i++)
	{
		mLumpsFound[i] = 0;
	}
}